

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

void accumu_costs_iv_adf(warm_cb *data,multi_learner *base,example *ec)

{
  warm_cb *data_00;
  reference pvVar1;
  long in_RDI;
  uint32_t action;
  uint32_t i;
  cb_class *cl;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  uint32_t in_stack_ffffffffffffffd8;
  uint uVar2;
  
  data_00 = (warm_cb *)(in_RDI + 0x100);
  for (uVar2 = 0; uVar2 < *(uint *)(in_RDI + 0x80); uVar2 = uVar2 + 1) {
    in_stack_ffffffffffffffd8 =
         predict_sublearner_adf
                   (data_00,(multi_learner *)CONCAT44(uVar2,in_stack_ffffffffffffffd8),
                    (example *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffcc);
    if (in_stack_ffffffffffffffd8 == *(uint32_t *)((long)&(data_00->cb_label).costs._begin + 4)) {
      in_stack_ffffffffffffffd4 =
           *(float *)&(data_00->cb_label).costs._begin / *(float *)&(data_00->cb_label).costs._end;
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xe8),(ulong)uVar2);
      *pvVar1 = in_stack_ffffffffffffffd4 + *pvVar1;
    }
  }
  return;
}

Assistant:

void accumu_costs_iv_adf(warm_cb& data, multi_learner& base, example& ec)
{
	CB::cb_class& cl = data.cl_adf;
	//IPS for approximating the cumulative costs for all lambdas
	for (uint32_t i = 0; i < data.choices_lambda; i++)
	{
		uint32_t action = predict_sublearner_adf(data, base, ec, i);

		if (action == cl.action)
			data.cumulative_costs[i] += cl.cost / cl.probability;
	}
}